

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

xmlChar * xmlParsePubidLiteral(xmlParserCtxtPtr ctxt)

{
  xmlParserInputState xVar1;
  xmlChar *pxVar2;
  xmlChar *pxVar3;
  xmlParserInputPtr pxVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  byte bVar8;
  byte bVar9;
  
  xVar1 = ctxt->instate;
  if (ctxt->progressive == 0) {
    pxVar4 = ctxt->input;
    if ((500 < (long)pxVar4->cur - (long)pxVar4->base) &&
       ((long)pxVar4->end - (long)pxVar4->cur < 500)) {
      xmlSHRINK(ctxt);
    }
  }
  bVar9 = *ctxt->input->cur;
  if (bVar9 != 0x22) {
    if (bVar9 != 0x27) {
      xmlFatalErr(ctxt,XML_ERR_LITERAL_NOT_STARTED,(char *)0x0);
      return (xmlChar *)0x0;
    }
    bVar9 = 0x27;
  }
  xmlNextChar(ctxt);
  pxVar2 = (xmlChar *)(*xmlMallocAtomic)(100);
  if (pxVar2 == (xmlChar *)0x0) {
    xmlErrMemory(ctxt,(char *)0x0);
  }
  else {
    ctxt->instate = XML_PARSER_PUBLIC_LITERAL;
    bVar8 = *ctxt->input->cur;
    uVar7 = 0;
    iVar5 = 100;
    iVar6 = 0;
    while( true ) {
      if ((bVar9 == bVar8) || (""[bVar8] == '\0')) {
        pxVar2[uVar7 & 0xffffffff] = '\0';
        if (bVar9 == bVar8) {
          xmlNextChar(ctxt);
        }
        else {
          xmlFatalErr(ctxt,XML_ERR_LITERAL_NOT_FINISHED,(char *)0x0);
        }
        ctxt->instate = xVar1;
        return pxVar2;
      }
      pxVar3 = pxVar2;
      if (iVar5 <= (int)uVar7 + 1) break;
LAB_0015b8b5:
      pxVar2 = pxVar3;
      pxVar2[uVar7] = bVar8;
      if (iVar6 < 0x32) {
        iVar6 = iVar6 + 1;
      }
      else {
        if ((ctxt->progressive == 0) && ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa)) {
          xmlGROW(ctxt);
        }
        iVar6 = 0;
        if (ctxt->instate == XML_PARSER_EOF) goto LAB_0015ba29;
      }
      xmlNextChar(ctxt);
      pxVar4 = ctxt->input;
      bVar8 = *pxVar4->cur;
      if (bVar8 == 0) {
        if (ctxt->progressive == 0) {
          if ((long)pxVar4->end - (long)pxVar4->cur < 0xfa) {
            xmlGROW(ctxt);
            pxVar4 = ctxt->input;
            if (ctxt->progressive != 0) goto LAB_0015b924;
          }
          if ((500 < (long)pxVar4->cur - (long)pxVar4->base) &&
             ((long)pxVar4->end - (long)pxVar4->cur < 500)) {
            xmlSHRINK(ctxt);
            pxVar4 = ctxt->input;
          }
        }
LAB_0015b924:
        bVar8 = *pxVar4->cur;
      }
      uVar7 = uVar7 + 1;
    }
    if ((iVar5 < 0xc351) || ((ctxt->options & 0x80000) != 0)) {
      iVar5 = iVar5 * 2;
      pxVar3 = (xmlChar *)(*xmlRealloc)(pxVar2,(long)iVar5);
      if (pxVar3 != (xmlChar *)0x0) goto LAB_0015b8b5;
      xmlErrMemory(ctxt,(char *)0x0);
    }
    else {
      xmlFatalErr(ctxt,XML_ERR_NAME_TOO_LONG,"Public ID");
    }
LAB_0015ba29:
    (*xmlFree)(pxVar2);
  }
  return (xmlChar *)0x0;
}

Assistant:

xmlChar *
xmlParsePubidLiteral(xmlParserCtxtPtr ctxt) {
    xmlChar *buf = NULL;
    int len = 0;
    int size = XML_PARSER_BUFFER_SIZE;
    xmlChar cur;
    xmlChar stop;
    int count = 0;
    xmlParserInputState oldstate = ctxt->instate;

    SHRINK;
    if (RAW == '"') {
        NEXT;
	stop = '"';
    } else if (RAW == '\'') {
        NEXT;
	stop = '\'';
    } else {
	xmlFatalErr(ctxt, XML_ERR_LITERAL_NOT_STARTED, NULL);
	return(NULL);
    }
    buf = (xmlChar *) xmlMallocAtomic(size * sizeof(xmlChar));
    if (buf == NULL) {
	xmlErrMemory(ctxt, NULL);
	return(NULL);
    }
    ctxt->instate = XML_PARSER_PUBLIC_LITERAL;
    cur = CUR;
    while ((IS_PUBIDCHAR_CH(cur)) && (cur != stop)) { /* checked */
	if (len + 1 >= size) {
	    xmlChar *tmp;

            if ((size > XML_MAX_NAME_LENGTH) &&
                ((ctxt->options & XML_PARSE_HUGE) == 0)) {
                xmlFatalErr(ctxt, XML_ERR_NAME_TOO_LONG, "Public ID");
                xmlFree(buf);
                return(NULL);
            }
	    size *= 2;
	    tmp = (xmlChar *) xmlRealloc(buf, size * sizeof(xmlChar));
	    if (tmp == NULL) {
		xmlErrMemory(ctxt, NULL);
		xmlFree(buf);
		return(NULL);
	    }
	    buf = tmp;
	}
	buf[len++] = cur;
	count++;
	if (count > 50) {
	    GROW;
	    count = 0;
            if (ctxt->instate == XML_PARSER_EOF) {
		xmlFree(buf);
		return(NULL);
            }
	}
	NEXT;
	cur = CUR;
	if (cur == 0) {
	    GROW;
	    SHRINK;
	    cur = CUR;
	}
    }
    buf[len] = 0;
    if (cur != stop) {
	xmlFatalErr(ctxt, XML_ERR_LITERAL_NOT_FINISHED, NULL);
    } else {
	NEXT;
    }
    ctxt->instate = oldstate;
    return(buf);
}